

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_class_declare(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos294;
  int yypos294;
  int yythunkpos293;
  int yypos293;
  int yythunkpos290;
  int yypos290;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  yyDo(G,yy_1_class_declare,G->begin,G->end,"yy_1_class_declare");
  iVar5 = yymatchString(G,"class");
  if (iVar5 == 0) goto LAB_00118de6;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar6 = yy_ws(G);
  if (iVar6 == 0) {
LAB_00118cdd:
    G->pos = iVar5;
    G->thunkpos = iVar3;
  }
  else {
    do {
      iVar6 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yy_ws(G);
    } while (iVar7 != 0);
    G->pos = iVar6;
    G->thunkpos = iVar4;
    iVar6 = yy_ident(G);
    if (iVar6 == 0) goto LAB_00118cdd;
    yyDo(G,yySet,-3,0,"yySet");
  }
  iVar5 = yy__(G);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar3 = G->thunkpos;
    iVar6 = yy_is_does_list(G);
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
    }
    else {
      yyDo(G,yySet,-2,0,"yySet");
    }
    iVar5 = yy__(G);
    if ((iVar5 != 0) && (iVar5 = yy_block(G), iVar5 != 0)) {
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_2_class_declare,G->begin,G->end,"yy_2_class_declare");
      yyDo(G,yyPop,3,0,"yyPop");
      return 1;
    }
  }
LAB_00118de6:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_class_declare(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "class_declare"));
  yyDo(G, yy_1_class_declare, G->begin, G->end, "yy_1_class_declare");
  if (!yymatchString(G, "class")) goto l289;

  {  int yypos290= G->pos, yythunkpos290= G->thunkpos;  if (!yy_ws(G))  goto l290;

  l292:;	
  {  int yypos293= G->pos, yythunkpos293= G->thunkpos;  if (!yy_ws(G))  goto l293;
  goto l292;
  l293:;	  G->pos= yypos293; G->thunkpos= yythunkpos293;
  }  if (!yy_ident(G))  goto l290;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l291;
  l290:;	  G->pos= yypos290; G->thunkpos= yythunkpos290;
  }
  l291:;	  if (!yy__(G))  goto l289;

  {  int yypos294= G->pos, yythunkpos294= G->thunkpos;  if (!yy_is_does_list(G))  goto l294;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l295;
  l294:;	  G->pos= yypos294; G->thunkpos= yythunkpos294;
  }
  l295:;	  if (!yy__(G))  goto l289;
  if (!yy_block(G))  goto l289;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_class_declare, G->begin, G->end, "yy_2_class_declare");
  yyprintf((stderr, "  ok   class_declare"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l289:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "class_declare"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}